

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Singular.hpp
# Opt level: O1

bool mserialize::detail::singular_impl(string_view full_tag,string_view tag,int max_recursion)

{
  bool bVar1;
  char *pcVar2;
  runtime_error *this;
  size_t sVar3;
  char *pcVar4;
  detail *pdVar5;
  char *pcVar6;
  bool bVar7;
  string_view tag_00;
  string_view tag_01;
  string_view tags;
  string_view tags_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  
  sVar3 = tag._len;
  tags._len = tag._ptr;
  if (max_recursion == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,full_tag._ptr,full_tag._ptr + full_tag._len);
    std::operator+(&local_50,"Recursion limit exceeded while visiting tag: ",&local_70);
    std::runtime_error::runtime_error(this,(string *)&local_50);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (sVar3 == 0) {
    bVar7 = true;
  }
  else {
    if (*tags._len == '{') {
      bVar7 = singular_struct(full_tag,tag,max_recursion + -1);
      return bVar7;
    }
    if (*tags._len == '(') {
      pdVar5 = (detail *)(tags._len + 1);
      pcVar6 = (char *)0x0;
      if (sVar3 != 1) {
        pcVar6 = (char *)(sVar3 - 2);
      }
      tags._ptr = pcVar6;
      pcVar2 = (char *)tag_first_size(pdVar5,tags);
      bVar7 = pcVar2 == (char *)0x0;
      if (!bVar7) {
        tag_00._len = (size_t)pcVar2;
        tag_00._ptr = (char *)pdVar5;
        bVar1 = singular_impl(full_tag,tag_00,max_recursion + -1);
        if (bVar1) {
          if (pcVar6 < pcVar2) {
            pcVar2 = pcVar6;
          }
          pcVar6 = pcVar6 + -(long)pcVar2;
          sVar3 = extraout_RDX;
          pdVar5 = pdVar5 + (long)pcVar2;
          do {
            tags_00._len = sVar3;
            tags_00._ptr = pcVar6;
            pcVar2 = (char *)tag_first_size(pdVar5,tags_00);
            bVar7 = pcVar2 == (char *)0x0;
            if (bVar7) {
              return bVar7;
            }
            pcVar4 = pcVar2;
            if (pcVar6 < pcVar2) {
              pcVar4 = pcVar6;
            }
            pcVar6 = pcVar6 + -(long)pcVar4;
            tag_01._len = (size_t)pcVar2;
            tag_01._ptr = (char *)pdVar5;
            bVar1 = singular_impl(full_tag,tag_01,max_recursion + -1);
            sVar3 = extraout_RDX_00;
            pdVar5 = pdVar5 + (long)pcVar4;
          } while (bVar1);
        }
      }
    }
    else {
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

inline bool singular_impl(string_view full_tag, string_view tag, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return true; }

  switch (tag.front())
  {
  case '(':
    return singular_tuple(full_tag, tag, max_recursion - 1);
  case '{':
    return singular_struct(full_tag, tag, max_recursion - 1);
  }

  return false;
}